

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void anon_unknown.dwarf_874a::prepareEnv
               (Map<String,_String> *environment,Array<String> *envStringsBuf)

{
  bool bVar1;
  usize size;
  Iterator *pIVar2;
  String *pSVar3;
  String local_78;
  String local_50;
  Iterator local_28;
  Iterator end;
  Iterator i;
  Array<String> *envStringsBuf_local;
  Map<String,_String> *environment_local;
  
  size = Map<String,_String>::size(environment);
  Array<String>::reserve(envStringsBuf,size);
  pIVar2 = Map<String,_String>::begin(environment);
  end.item = pIVar2->item;
  pIVar2 = Map<String,_String>::end(environment);
  local_28.item = pIVar2->item;
  while( true ) {
    bVar1 = Map<String,_String>::Iterator::operator!=(&end,&local_28);
    if (!bVar1) break;
    pSVar3 = Map<String,_String>::Iterator::key(&end);
    String::operator+(&local_78,pSVar3,(char (*) [2])"=");
    pSVar3 = Map<String,_String>::Iterator::operator*(&end);
    String::operator+(&local_50,&local_78,pSVar3);
    Array<String>::append(envStringsBuf,&local_50);
    String::~String(&local_50);
    String::~String(&local_78);
    Map<String,_String>::Iterator::operator++(&end);
  }
  return;
}

Assistant:

void prepareEnv(const Map<String, String>& environment, Array<String>& envStringsBuf)
  {
    envStringsBuf.reserve(environment.size());
      for (Map<String, String>::Iterator i = environment.begin(), end = environment.end(); i != end; ++i)
        envStringsBuf.append(i.key() + "=" + *i);
  }